

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int make_fflags_entry(archive_write *a,xml_writer *writer,char *element,char *fflags_text)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  flagentry *pfVar6;
  char *__s2;
  flagentry *pfVar7;
  int local_4c;
  
  iVar1 = strcmp(element,"ext2");
  pfVar7 = make_fflags_entry::flagbsd;
  if (iVar1 == 0) {
    pfVar7 = make_fflags_entry::flagext2;
  }
  pcVar5 = pfVar7->name;
  local_4c = 0;
  do {
    pcVar3 = strchr(fflags_text,0x2c);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(fflags_text);
      pcVar3 = fflags_text + sVar4;
    }
    if (pcVar5 != (char *)0x0) {
      __s2 = pcVar5;
      pfVar6 = pfVar7;
      do {
        pfVar6 = pfVar6 + 1;
        if (((__s2[(long)pcVar3 - (long)fflags_text] == '\0') && (*fflags_text == *__s2)) &&
           (iVar1 = strncmp(fflags_text,__s2,(long)pcVar3 - (long)fflags_text), iVar1 == 0)) {
          local_4c = local_4c + 1;
          break;
        }
        __s2 = pfVar6->name;
      } while (__s2 != (char *)0x0);
    }
    fflags_text = pcVar3 + 1;
    if (*pcVar3 != ',') {
      iVar1 = 0;
      if (0 < local_4c) {
        uVar2 = xmlTextWriterStartElement(writer->writer,element);
        if ((int)uVar2 < 0) {
          pcVar5 = "xml_writer_start_element() failed: %d";
        }
        else {
          uVar2 = xmlTextWriterEndElement(writer->writer);
          if (-1 < (int)uVar2) {
            return 0;
          }
          pcVar5 = "xml_writer_end_element() failed: %d";
        }
        archive_set_error(&a->archive,-1,pcVar5,(ulong)uVar2);
        iVar1 = -0x1e;
      }
      return iVar1;
    }
  } while( true );
}

Assistant:

static int
make_fflags_entry(struct archive_write *a, struct xml_writer *writer,
    const char *element, const char *fflags_text)
{
	static const struct flagentry {
		const char	*name;
		const char	*xarname;
	}
	flagbsd[] = {
		{ "sappnd",	"SystemAppend"},
		{ "sappend",	"SystemAppend"},
		{ "arch",	"SystemArchived"},
		{ "archived",	"SystemArchived"},
		{ "schg",	"SystemImmutable"},
		{ "schange",	"SystemImmutable"},
		{ "simmutable",	"SystemImmutable"},
		{ "nosunlnk",	"SystemNoUnlink"},
		{ "nosunlink",	"SystemNoUnlink"},
		{ "snapshot",	"SystemSnapshot"},
		{ "uappnd",	"UserAppend"},
		{ "uappend",	"UserAppend"},
		{ "uchg",	"UserImmutable"},
		{ "uchange",	"UserImmutable"},
		{ "uimmutable",	"UserImmutable"},
		{ "nodump",	"UserNoDump"},
		{ "noopaque",	"UserOpaque"},
		{ "nouunlnk",	"UserNoUnlink"},
		{ "nouunlink",	"UserNoUnlink"},
		{ NULL, NULL}
	},
	flagext2[] = {
		{ "sappnd",	"AppendOnly"},
		{ "sappend",	"AppendOnly"},
		{ "schg",	"Immutable"},
		{ "schange",	"Immutable"},
		{ "simmutable",	"Immutable"},
		{ "nodump",	"NoDump"},
		{ "nouunlnk",	"Undelete"},
		{ "nouunlink",	"Undelete"},
		{ "btree",	"BTree"},
		{ "comperr",	"CompError"},
		{ "compress",	"Compress"},
		{ "noatime",	"NoAtime"},
		{ "compdirty",	"CompDirty"},
		{ "comprblk",	"CompBlock"},
		{ "dirsync",	"DirSync"},
		{ "hashidx",	"HashIndexed"},
		{ "imagic",	"iMagic"},
		{ "journal",	"Journaled"},
		{ "securedeletion",	"SecureDeletion"},
		{ "sync",	"Synchronous"},
		{ "notail",	"NoTail"},
		{ "topdir",	"TopDir"},
		{ "reserved",	"Reserved"},
		{ NULL, NULL}
	};
	const struct flagentry *fe, *flagentry;
#define FLAGENTRY_MAXSIZE ((sizeof(flagbsd)+sizeof(flagext2))/sizeof(flagbsd))
	const struct flagentry *avail[FLAGENTRY_MAXSIZE];
	const char *p;
	int i, n, r;

	if (strcmp(element, "ext2") == 0)
		flagentry = flagext2;
	else
		flagentry = flagbsd;
	n = 0;
	p = fflags_text;
	do {
		const char *cp;

		cp = strchr(p, ',');
		if (cp == NULL)
			cp = p + strlen(p);

		for (fe = flagentry; fe->name != NULL; fe++) {
			if (fe->name[cp - p] != '\0'
			    || p[0] != fe->name[0])
				continue;
			if (strncmp(p, fe->name, cp - p) == 0) {
				avail[n++] = fe;
				break;
			}
		}
		if (*cp == ',')
			p = cp + 1;
		else
			p = NULL;
	} while (p != NULL);

	if (n > 0) {
		r = xml_writer_start_element(writer, element);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		for (i = 0; i < n; i++) {
			r = xmlwrite_string(a, writer,
			    avail[i]->xarname, NULL);
			if (r != ARCHIVE_OK)
				return (r);
		}

		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}
	return (ARCHIVE_OK);
}